

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int client_do_handle_certificate(ptls_t *tls,uint8_t *src,uint8_t *end)

{
  int iVar1;
  int iVar2;
  int got_certs;
  
  iVar1 = handle_certificate(tls,src,end,&got_certs);
  iVar2 = 0x2f;
  if (got_certs != 0) {
    iVar2 = 0;
  }
  if (iVar1 == 0) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

static int client_do_handle_certificate(ptls_t *tls, const uint8_t *src, const uint8_t *end)
{
    int got_certs, ret;

    if ((ret = handle_certificate(tls, src, end, &got_certs)) != 0)
        return ret;
    if (!got_certs)
        return PTLS_ALERT_ILLEGAL_PARAMETER;

    return 0;
}